

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O2

int __thiscall rudp::session::connect(session *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  service_registry *psVar1;
  int extraout_EAX;
  io_service *piVar2;
  undefined4 in_register_00000034;
  int in_R8D;
  undefined1 auStack_88 [16];
  undefined1 local_78 [24];
  code *pcStack_60;
  __0 local_58 [8];
  impl_type *piStack_50;
  service_registry *local_48;
  function<void_(bool,_unsigned_int)> local_40;
  
  this->client = true;
  generate_syn((session *)auStack_88,SUB81(this,0));
  local_58 = (__0  [8])this;
  std::__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<rudp::session,void>
            ((__shared_ptr<rudp::session,(__gnu_cxx::_Lock_policy)2> *)&piStack_50,
             (__weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::function<void_(bool,_unsigned_int)>::function
            (&local_40,(function<void_(bool,_unsigned_int)> *)CONCAT44(in_register_00000034,__fd));
  local_78._16_8_ = 0;
  pcStack_60 = (code *)0x0;
  local_78._0_8_ = (io_service *)0x0;
  local_78._8_8_ = (socket *)0x0;
  piVar2 = (io_service *)operator_new(0x38);
  psVar1 = local_48;
  local_48 = (service_registry *)0x0;
  (piVar2->super_execution_context).service_registry_ = (service_registry *)local_58;
  piVar2->impl_ = piStack_50;
  piStack_50 = (impl_type *)0x0;
  piVar2[1].super_execution_context.service_registry_ = psVar1;
  std::function<void_(bool,_unsigned_int)>::function
            ((function<void_(bool,_unsigned_int)> *)&piVar2[1].impl_,&local_40);
  pcStack_60 = std::
               _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:123:41)>
               ::_M_invoke;
  local_78._16_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Fadis[P]rudp/src/rudp.cpp:123:41)>
       ::_M_manager;
  local_78._0_8_ = piVar2;
  send(this,(int)auStack_88,(void *)0x0,(size_t)local_78,in_R8D);
  std::_Function_base::~_Function_base((_Function_base *)local_78);
  connect(std::function<void(bool,unsigned_int)>const&)::$_0::~__0(local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_88 + 8));
  return extraout_EAX;
}

Assistant:

void session::connect( const std::function< void( bool, uint32_t ) > &cb ) {
    client = true;
    send( generate_syn( false ), false, [this,this_=shared_from_this(),cb]( bool status ) {
      cb( status, self_config.connection_identifier );
    } );
  }